

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::~App(App *this)

{
  App *this_local;
  
  this->_vptr_App = (_func_int **)&PTR__App_00499640;
  std::shared_ptr<CLI::Config>::~shared_ptr(&this->config_formatter_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->aliases_);
  ::std::__cxx11::string::~string((string *)&this->group_);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::~vector
            (&this->subcommands_);
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
            (&this->need_options_);
  std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::~set
            (&this->need_subcommands_);
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
            (&this->exclude_options_);
  std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::~set
            (&this->exclude_subcommands_);
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&this->parsed_subcommands_);
  std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::~vector(&this->parse_order_);
  std::
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->missing_);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
  ::~function(&this->failure_message_);
  std::shared_ptr<CLI::FormatterBase>::~shared_ptr(&this->formatter_);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function(&this->footer_callback_);
  ::std::__cxx11::string::~string((string *)&this->footer_);
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::~vector(&this->options_);
  OptionDefaults::~OptionDefaults(&this->option_defaults_);
  std::function<void_()>::~function(&this->final_callback_);
  std::function<void_()>::~function(&this->parse_complete_callback_);
  std::function<void_(unsigned_long)>::~function(&this->pre_parse_callback_);
  ::std::__cxx11::string::~string((string *)&this->description_);
  ::std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~App() = default;